

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_tools.h
# Opt level: O1

void __thiscall
ncnn::SafeOrderList<ncnn::ObjectBox>::pop_front(SafeOrderList<ncnn::ObjectBox> *this)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  
  pthread_mutex_lock((pthread_mutex_t *)&this->mutex);
  p_Var2 = (this->container).super__List_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>.
           _M_impl._M_node.super__List_node_base._M_next;
  psVar1 = &(this->container).super__List_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>.
            _M_impl._M_node._M_size;
  *psVar1 = *psVar1 - 1;
  std::__detail::_List_node_base::_M_unhook();
  operator_delete(p_Var2,0x28);
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex);
  return;
}

Assistant:

void pop_front()
  {
    MutexLockGuard guard(mutex);
    container.pop_front();
  }